

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::set_ssl_cert
          (torrent *this,string *certificate,string *private_key,string *dh_params,
          string *passphrase)

{
  context *this_00;
  undefined8 args_2;
  int iVar1;
  password_callback_base *callback;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  error_code ec;
  undefined1 local_78 [72];
  
  this_00 = (this->m_ssl_ctx)._M_t.
            super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
            ._M_t.
            super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
            .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl;
  local_78._32_8_ = private_key;
  if (this_00 == (context *)0x0) {
    iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    if ((*(uint *)(CONCAT44(extraout_var_07,iVar1) + 0x68) & 0x41) != 0) {
      iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_78);
      ec.val_ = 0x71;
      alert_manager::
      emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,libtorrent::errors::error_code_enum,char_const(&)[1]>
                ((alert_manager *)CONCAT44(extraout_var_08,iVar1),(torrent_handle *)local_78,
                 (error_code_enum *)&ec,(char (*) [1])0x3829db);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
    }
  }
  else {
    ec.val_ = 0;
    ec.failed_ = false;
    ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
               super_error_category;
    ::std::__cxx11::string::string((string *)(local_78 + 0x28),(string *)passphrase);
    callback = (password_callback_base *)operator_new(0x28);
    ::std::__cxx11::string::string((string *)local_78,(string *)(local_78 + 0x28));
    callback->_vptr_password_callback_base = (_func_int **)&PTR__password_callback_004d0560;
    ::std::__cxx11::string::string((string *)(callback + 1),(string *)local_78);
    boost::asio::ssl::context::do_set_password_callback(this_00,callback,&ec);
    ::std::__cxx11::string::~string((string *)local_78);
    ::std::__cxx11::string::~string((string *)(local_78 + 0x28));
    if (ec.failed_ == true) {
      iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      if ((*(uint *)(CONCAT44(extraout_var,iVar1) + 0x68) & 0x41) != 0) {
        iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        get_handle((torrent *)local_78);
        alert_manager::
        emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,boost::system::error_code&,char_const(&)[1]>
                  ((alert_manager *)CONCAT44(extraout_var_00,iVar1),(torrent_handle *)local_78,&ec,
                   (char (*) [1])0x3829db);
        ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
      }
    }
    boost::asio::ssl::context::use_certificate_file
              ((this->m_ssl_ctx)._M_t.
               super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
               ._M_t.
               super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
               .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl,certificate,
               pem,&ec);
    if (ec.failed_ == true) {
      iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      if ((*(uint *)(CONCAT44(extraout_var_01,iVar1) + 0x68) & 0x41) != 0) {
        iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        get_handle((torrent *)local_78);
        alert_manager::
        emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,boost::system::error_code&,std::__cxx11::string_const&>
                  ((alert_manager *)CONCAT44(extraout_var_02,iVar1),(torrent_handle *)local_78,&ec,
                   certificate);
        ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
      }
    }
    iVar1 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
    if ((char)iVar1 != '\0') {
      (*(ec.cat_)->_vptr_error_category[4])((string *)local_78,ec.cat_,(ulong)(uint)ec.val_);
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"*** use certificate file: %s",local_78._0_8_);
      ::std::__cxx11::string::~string((string *)local_78);
    }
    args_2 = local_78._32_8_;
    boost::asio::ssl::context::use_private_key_file
              ((this->m_ssl_ctx)._M_t.
               super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
               ._M_t.
               super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
               .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl,
               (string *)local_78._32_8_,pem,&ec);
    if (ec.failed_ == true) {
      iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      if ((*(uint *)(CONCAT44(extraout_var_03,iVar1) + 0x68) & 0x41) != 0) {
        iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        get_handle((torrent *)local_78);
        alert_manager::
        emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,boost::system::error_code&,std::__cxx11::string_const&>
                  ((alert_manager *)CONCAT44(extraout_var_04,iVar1),(torrent_handle *)local_78,&ec,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_2);
        ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
      }
    }
    iVar1 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
    if ((char)iVar1 != '\0') {
      (*(ec.cat_)->_vptr_error_category[4])((string *)local_78,ec.cat_,(ulong)(uint)ec.val_);
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"*** use private key file: %s",local_78._0_8_);
      ::std::__cxx11::string::~string((string *)local_78);
    }
    boost::asio::ssl::context::use_tmp_dh_file
              ((this->m_ssl_ctx)._M_t.
               super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
               ._M_t.
               super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
               .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl,dh_params,&ec
              );
    if (ec.failed_ == true) {
      iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      if ((*(uint *)(CONCAT44(extraout_var_05,iVar1) + 0x68) & 0x41) != 0) {
        iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        get_handle((torrent *)local_78);
        alert_manager::
        emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,boost::system::error_code&,std::__cxx11::string_const&>
                  ((alert_manager *)CONCAT44(extraout_var_06,iVar1),(torrent_handle *)local_78,&ec,
                   dh_params);
        ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
      }
    }
    iVar1 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
    if ((char)iVar1 != '\0') {
      (*(ec.cat_)->_vptr_error_category[4])((string *)local_78,ec.cat_,(ulong)(uint)ec.val_);
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"*** use DH file: %s",local_78._0_8_);
      ::std::__cxx11::string::~string((string *)local_78);
    }
  }
  return;
}

Assistant:

void torrent::set_ssl_cert(std::string const& certificate
		, std::string const& private_key
		, std::string const& dh_params
		, std::string const& passphrase)
	{
		if (!m_ssl_ctx)
		{
			if (alerts().should_post<torrent_error_alert>())
				alerts().emplace_alert<torrent_error_alert>(get_handle()
					, errors::not_an_ssl_torrent, "");
			return;
		}

		error_code ec;
		m_ssl_ctx->set_password_callback(
				[passphrase](std::size_t, ssl::context::password_purpose purpose)
				{
					return purpose == ssl::context::for_reading ? passphrase : "";
				}
				, ec);
		if (ec)
		{
			if (alerts().should_post<torrent_error_alert>())
				alerts().emplace_alert<torrent_error_alert>(get_handle(), ec, "");
		}
		m_ssl_ctx->use_certificate_file(certificate, ssl::context::pem, ec);
		if (ec)
		{
			if (alerts().should_post<torrent_error_alert>())
				alerts().emplace_alert<torrent_error_alert>(get_handle(), ec, certificate);
		}
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
			debug_log("*** use certificate file: %s", ec.message().c_str());
#endif
		m_ssl_ctx->use_private_key_file(private_key, ssl::context::pem, ec);
		if (ec)
		{
			if (alerts().should_post<torrent_error_alert>())
				alerts().emplace_alert<torrent_error_alert>(get_handle(), ec, private_key);
		}
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
			debug_log("*** use private key file: %s", ec.message().c_str());
#endif
		m_ssl_ctx->use_tmp_dh_file(dh_params, ec);
		if (ec)
		{
			if (alerts().should_post<torrent_error_alert>())
				alerts().emplace_alert<torrent_error_alert>(get_handle(), ec, dh_params);
		}
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
			debug_log("*** use DH file: %s", ec.message().c_str());
#endif
	}